

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_CopyAssignment_Test::~StatePointer_CopyAssignment_Test
          (StatePointer_CopyAssignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, CopyAssignment) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{nullptr, 0};
	ASSERT_NE(p1, p2);
	p2 = p1;
	ASSERT_EQ(p1, p2);
}